

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

vector<duckdb::TemporaryFileInformation,_true> * __thiscall
duckdb::TemporaryFileManager::GetTemporaryFiles
          (vector<duckdb::TemporaryFileInformation,_true> *__return_storage_ptr__,
          TemporaryFileManager *this)

{
  int iVar1;
  mapped_type *pmVar2;
  pointer this_00;
  pointer pTVar3;
  _Hash_node_base *p_Var4;
  initializer_list<duckdb::TemporaryBufferSize> __l;
  allocator_type local_a1;
  pthread_mutex_t *local_a0;
  TemporaryFileManager *local_98;
  vector<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_> local_90;
  TemporaryFileInformation local_78;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a0 = (pthread_mutex_t *)&this->manager_lock;
  local_98 = this;
  iVar1 = pthread_mutex_lock(local_a0);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = 0x38000;
  uStack_40 = 0x40000;
  local_78.size = 0x28000;
  uStack_50 = 0x30000;
  local_78.path.field_2._M_allocated_capacity = 0x18000;
  local_78.path.field_2._8_8_ = 0x20000;
  local_78.path._M_dataplus._M_p = (pointer)0x8000;
  local_78.path._M_string_length = 0x10000;
  __l._M_len = 8;
  __l._M_array = (iterator)&local_78;
  ::std::vector<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>::vector
            (&local_90,__l,&local_a1);
  if (local_90.
      super__Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_98 = (TemporaryFileManager *)&(local_98->files).files;
    pTVar3 = local_90.
             super__Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_78.path._M_dataplus._M_p = (pointer)*pTVar3;
      pmVar2 = ::std::__detail::
               _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_98,(key_type *)&local_78);
      for (p_Var4 = (pmVar2->_M_h)._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
          p_Var4 = p_Var4->_M_nxt) {
        this_00 = unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                  ::operator->((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                                *)(p_Var4 + 2));
        TemporaryFileHandle::GetTemporaryFile(&local_78,this_00);
        ::std::
        vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
        ::emplace_back<duckdb::TemporaryFileInformation>
                  (&__return_storage_ptr__->
                    super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
                   ,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.path._M_dataplus._M_p != &local_78.path.field_2) {
          operator_delete(local_78.path._M_dataplus._M_p);
        }
      }
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != local_90.
                       super__Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_90.
      super__Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<duckdb::TemporaryBufferSize,_std::allocator<duckdb::TemporaryBufferSize>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(local_a0);
  return __return_storage_ptr__;
}

Assistant:

vector<TemporaryFileInformation> TemporaryFileManager::GetTemporaryFiles() {
	lock_guard<mutex> lock(manager_lock);
	vector<TemporaryFileInformation> result;
	for (auto &size : TemporaryBufferSizes()) {
		for (const auto &file : files.GetMapForSize(size)) {
			result.push_back(file.second->GetTemporaryFile());
		}
	}
	return result;
}